

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sclLiberty.c
# Opt level: O0

char * Scl_LibertyReadString(Scl_Tree_t *p,Scl_Pair_t Pair)

{
  Scl_Tree_t *p_local;
  Scl_Pair_t Pair_local;
  
  p_local._4_4_ = Pair.End;
  p_local._0_4_ = Pair.Beg;
  if (4999 < p_local._4_4_ - (int)p_local) {
    __assert_fail("Pair.End-Pair.Beg < ABC_MAX_LIB_STR_LEN",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/map/scl/sclLiberty.c"
                  ,0x158,"char *Scl_LibertyReadString(Scl_Tree_t *, Scl_Pair_t)");
  }
  strncpy(Scl_LibertyReadString::Buffer,p->pContents + (int)p_local,
          (long)(p_local._4_4_ - (int)p_local));
  if (((int)p_local < p_local._4_4_) && (Scl_LibertyReadString::Buffer[0] == '\"')) {
    if (Scl_LibertyReadString::Buffer[(p_local._4_4_ - (int)p_local) + -1] != '\"') {
      __assert_fail("Buffer[Pair.End-Pair.Beg-1] == \'\\\"\'",
                    "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/map/scl/sclLiberty.c"
                    ,0x15c,"char *Scl_LibertyReadString(Scl_Tree_t *, Scl_Pair_t)");
    }
    Scl_LibertyReadString::Buffer[(p_local._4_4_ - (int)p_local) + -1] = '\0';
    Pair_local = (Scl_Pair_t)((long)Scl_LibertyReadString::Buffer + 1);
  }
  else {
    Scl_LibertyReadString::Buffer[p_local._4_4_ - (int)p_local] = '\0';
    Pair_local = (Scl_Pair_t)Scl_LibertyReadString::Buffer;
  }
  return (char *)Pair_local;
}

Assistant:

char * Scl_LibertyReadString( Scl_Tree_t * p, Scl_Pair_t Pair )   
{ 
    static char Buffer[ABC_MAX_LIB_STR_LEN]; 
    assert( Pair.End-Pair.Beg < ABC_MAX_LIB_STR_LEN );
    strncpy( Buffer, p->pContents+Pair.Beg, Pair.End-Pair.Beg ); 
    if ( Pair.Beg < Pair.End && Buffer[0] == '\"' )
    {
        assert( Buffer[Pair.End-Pair.Beg-1] == '\"' );
        Buffer[Pair.End-Pair.Beg-1] = 0;
        return Buffer + 1;
    }
    Buffer[Pair.End-Pair.Beg] = 0;
    return Buffer;
}